

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

PSBTAnalysis * node::AnalyzePSBT(PartiallySignedTransaction *psbtx)

{
  bool bVar1;
  bool bVar2;
  undefined1 finalize;
  bool bVar3;
  PrecomputedTransactionData *pPVar4;
  PrecomputedTransactionData *pPVar5;
  reference pvVar6;
  reference pvVar7;
  PartiallySignedTransaction *pPVar8;
  iterator iVar9;
  iterator iVar10;
  SignatureData *out_sigdata;
  PartiallySignedTransaction *pPVar11;
  reference pvVar12;
  CAmount *nFeePaid;
  optional<CFeeRate> *this;
  vector<CKeyID,_std::allocator<CKeyID>_> *in_RSI;
  SignatureData *in_RDI;
  long in_FS_OFFSET;
  PSBTInput *input_1;
  uint i_2;
  bool success;
  PSBTInputAnalysis *input_analysis_1;
  uint i_1;
  bool complete;
  PSBTInputAnalysis *input_analysis;
  PSBTInput *input;
  CAmount in_amt;
  bool calc_fee;
  PSBTAnalysis *result;
  CFeeRate feerate;
  size_t size;
  CCoinsView view_dummy;
  CMutableTransaction mtx;
  CAmount fee;
  CAmount out_amt;
  uint i;
  CTransaction ctx;
  Coin newcoin;
  CCoinsViewCache view;
  SignatureData outdata;
  CTxOut utxo;
  PrecomputedTransactionData txdata;
  undefined4 in_stack_fffffffffffff558;
  uint in_stack_fffffffffffff55c;
  CScript *in_stack_fffffffffffff560;
  CTransaction *in_stack_fffffffffffff568;
  string *in_stack_fffffffffffff570;
  PSBTAnalysis *in_stack_fffffffffffff578;
  CMutableTransaction *in_stack_fffffffffffff580;
  undefined6 in_stack_fffffffffffff588;
  undefined1 in_stack_fffffffffffff58e;
  undefined1 in_stack_fffffffffffff58f;
  PartiallySignedTransaction *in_stack_fffffffffffff590;
  allocator<char> *in_stack_fffffffffffff598;
  CTransaction *this_00;
  PartiallySignedTransaction *in_stack_fffffffffffff5a0;
  char *__s;
  uint32_t flags;
  undefined7 in_stack_fffffffffffff5a8;
  undefined1 in_stack_fffffffffffff5af;
  SignatureData *in_stack_fffffffffffff5b0;
  CCoinsViewCache *in_stack_fffffffffffff5b8;
  PrecomputedTransactionData *in_stack_fffffffffffff5c0;
  uint in_stack_fffffffffffff5cc;
  undefined2 uVar13;
  PartiallySignedTransaction *in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d8;
  undefined1 in_stack_fffffffffffff5dc;
  byte in_stack_fffffffffffff5dd;
  undefined1 in_stack_fffffffffffff5de;
  undefined1 in_stack_fffffffffffff5df;
  SignatureData *psbt;
  uint local_9f0;
  uint local_9cc;
  long local_9a0;
  undefined1 local_970 [88];
  long local_918;
  uint local_90c;
  uchar local_908 [8];
  char *pcStack_900;
  undefined8 local_8f8;
  char *pcStack_8f0;
  uint local_840;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined4 local_3a8;
  undefined8 local_3a4;
  undefined8 uStack_39c;
  undefined8 local_394;
  undefined8 uStack_38c;
  long local_158;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  psbt = in_RDI;
  PSBTAnalysis::PSBTAnalysis
            ((PSBTAnalysis *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  bVar1 = true;
  local_9a0 = 0;
  std::optional<CMutableTransaction>::operator->
            ((optional<CMutableTransaction> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::size
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>::resize
            ((vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_> *)
             in_stack_fffffffffffff578,(size_type)in_stack_fffffffffffff570);
  PrecomputePSBTData(in_stack_fffffffffffff5d0);
  local_90c = 0;
  while( true ) {
    pPVar4 = (PrecomputedTransactionData *)(ulong)local_90c;
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    pPVar5 = (PrecomputedTransactionData *)
             std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                        CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    if (pPVar5 <= pPVar4) break;
    std::vector<PSBTInput,_std::allocator<PSBTInput>_>::operator[]
              ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffff568,
               (size_type)in_stack_fffffffffffff560);
    pvVar6 = std::vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>::
             operator[]((vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_> *
                        )in_stack_fffffffffffff568,(size_type)in_stack_fffffffffffff560);
    pvVar6->next = EXTRACTOR;
    CTxOut::CTxOut((CTxOut *)in_stack_fffffffffffff578);
    in_stack_fffffffffffff5df =
         PartiallySignedTransaction::GetInputUTXO
                   (in_stack_fffffffffffff590,
                    (CTxOut *)
                    CONCAT17(in_stack_fffffffffffff58f,
                             CONCAT16(in_stack_fffffffffffff58e,in_stack_fffffffffffff588)),
                    (int)((ulong)in_stack_fffffffffffff580 >> 0x20));
    if ((bool)in_stack_fffffffffffff5df) {
      in_stack_fffffffffffff5de =
           MoneyRange((CAmount *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      in_stack_fffffffffffff5dd = 1;
      if ((bool)in_stack_fffffffffffff5de) {
        local_918 = local_9a0 + local_158;
        in_stack_fffffffffffff5dc =
             MoneyRange((CAmount *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        in_stack_fffffffffffff5dd = in_stack_fffffffffffff5dc ^ 0xff;
      }
      if ((in_stack_fffffffffffff5dd & 1) == 0) {
        local_9a0 = local_158 + local_9a0;
        pvVar6->has_utxo = true;
        goto LAB_0094eb3d;
      }
      tinyformat::format<unsigned_int>
                ((char *)CONCAT17(in_stack_fffffffffffff58f,
                                  CONCAT16(in_stack_fffffffffffff58e,in_stack_fffffffffffff588)),
                 (uint *)in_stack_fffffffffffff580);
      PSBTAnalysis::SetInvalid(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      bVar3 = true;
      bVar2 = true;
    }
    else {
      bVar2 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      if (bVar2) {
        std::optional<CMutableTransaction>::operator->
                  ((optional<CMutableTransaction> *)
                   CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        pvVar7 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                           (&in_stack_fffffffffffff568->vin,(size_type)in_stack_fffffffffffff560);
        in_stack_fffffffffffff5d0 = (PartiallySignedTransaction *)(ulong)(pvVar7->prevout).n;
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        pPVar8 = (PartiallySignedTransaction *)
                 std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                           ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                            CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        if (pPVar8 <= in_stack_fffffffffffff5d0) {
          tinyformat::format<unsigned_int>
                    ((char *)CONCAT17(in_stack_fffffffffffff58f,
                                      CONCAT16(in_stack_fffffffffffff58e,in_stack_fffffffffffff588))
                     ,(uint *)in_stack_fffffffffffff580);
          PSBTAnalysis::SetInvalid(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
          bVar3 = true;
          bVar2 = true;
          goto LAB_0094ee88;
        }
      }
      pvVar6->has_utxo = false;
      pvVar6->is_final = false;
      pvVar6->next = UPDATER;
      bVar1 = false;
LAB_0094eb3d:
      bVar2 = CTxOut::IsNull((CTxOut *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558)
                            );
      in_stack_fffffffffffff5cc = CONCAT13(bVar2,(int3)in_stack_fffffffffffff5cc);
      if (!bVar2) {
        bVar2 = CScript::IsUnspendable(in_stack_fffffffffffff560);
        in_stack_fffffffffffff5cc =
             CONCAT13((char)(in_stack_fffffffffffff5cc >> 0x18),
                      CONCAT12(bVar2,(short)in_stack_fffffffffffff5cc));
        if (bVar2) {
          tinyformat::format<unsigned_int>
                    ((char *)CONCAT17(in_stack_fffffffffffff58f,
                                      CONCAT16(in_stack_fffffffffffff58e,in_stack_fffffffffffff588))
                     ,(uint *)in_stack_fffffffffffff580);
          PSBTAnalysis::SetInvalid(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
          bVar3 = true;
          bVar2 = true;
          goto LAB_0094ee88;
        }
      }
      uVar13 = (undefined2)(in_stack_fffffffffffff5cc >> 0x10);
      PartiallySignedTransaction::PartiallySignedTransaction
                ((PartiallySignedTransaction *)
                 CONCAT17(in_stack_fffffffffffff5af,in_stack_fffffffffffff5a8),
                 in_stack_fffffffffffff5a0);
      bVar2 = PSBTInputSignedAndVerified
                        ((PartiallySignedTransaction *)psbt,(uint)((ulong)in_RDI >> 0x20),pPVar4);
      in_stack_fffffffffffff5cc = CONCAT31(CONCAT21(uVar13,bVar2),bVar2) ^ 0xff;
      PartiallySignedTransaction::~PartiallySignedTransaction
                ((PartiallySignedTransaction *)
                 CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      if ((in_stack_fffffffffffff5cc & 1) == 0) {
        bVar2 = CTxOut::IsNull((CTxOut *)
                               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        if (!bVar2) {
          pvVar6->is_final = true;
        }
      }
      else {
        pvVar6->is_final = false;
        SignatureData::SignatureData(in_RDI);
        in_stack_fffffffffffff558 = 1;
        bVar2 = SignPSBTInput((SigningProvider *)
                              CONCAT17(in_stack_fffffffffffff5df,
                                       CONCAT16(in_stack_fffffffffffff5de,
                                                CONCAT15(in_stack_fffffffffffff5dd,
                                                         CONCAT14(in_stack_fffffffffffff5dc,
                                                                  in_stack_fffffffffffff5d8)))),
                              in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
                              in_stack_fffffffffffff5c0,
                              (int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                              in_stack_fffffffffffff5b0,(bool)in_stack_fffffffffffff5af);
        if (bVar2) {
          pvVar6->next = FINALIZER;
        }
        else {
          std::vector<CKeyID,_std::allocator<CKeyID>_>::operator=
                    (in_RSI,(vector<CKeyID,_std::allocator<CKeyID>_> *)psbt);
          *(undefined4 *)
           ((pvVar6->missing_redeem_script).super_base_blob<160U>.m_data._M_elems + 0x10) =
               local_3a8;
          *(undefined8 *)(pvVar6->missing_redeem_script).super_base_blob<160U>.m_data._M_elems =
               local_3b8;
          *(undefined8 *)((pvVar6->missing_redeem_script).super_base_blob<160U>.m_data._M_elems + 8)
               = uStack_3b0;
          *(undefined8 *)
           ((pvVar6->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 0x10) =
               local_394;
          *(undefined8 *)
           ((pvVar6->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 0x18) =
               uStack_38c;
          *(undefined8 *)(pvVar6->missing_witness_script).super_base_blob<256U>.m_data._M_elems =
               local_3a4;
          *(undefined8 *)
           ((pvVar6->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 8) = uStack_39c
          ;
          std::vector<CKeyID,_std::allocator<CKeyID>_>::operator=
                    (in_RSI,(vector<CKeyID,_std::allocator<CKeyID>_> *)psbt);
          bVar2 = std::vector<CKeyID,_std::allocator<CKeyID>_>::empty
                            ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffff568);
          if ((((!bVar2) ||
               (bVar2 = base_blob<160U>::IsNull((base_blob<160U> *)in_stack_fffffffffffff568),
               !bVar2)) ||
              (bVar2 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffff568), !bVar2
              )) || (bVar2 = std::vector<CKeyID,_std::allocator<CKeyID>_>::empty
                                       ((vector<CKeyID,_std::allocator<CKeyID>_> *)
                                        in_stack_fffffffffffff568), bVar2)) {
            pvVar6->next = UPDATER;
          }
          else {
            pvVar6->next = SIGNER;
          }
        }
        SignatureData::~SignatureData
                  ((SignatureData *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      }
      bVar2 = false;
    }
LAB_0094ee88:
    CTxOut::~CTxOut((CTxOut *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    if (bVar2) goto LAB_0094f565;
    local_90c = local_90c + 1;
  }
  *(PSBTRole *)&(psbt->witness_script).super_CScriptBase._union = EXTRACTOR;
  local_9cc = 0;
  while( true ) {
    pPVar4 = (PrecomputedTransactionData *)(ulong)local_9cc;
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    pPVar5 = (PrecomputedTransactionData *)
             std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                        CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    if (pPVar5 <= pPVar4) break;
    std::vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>::operator[]
              ((vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_> *)
               in_stack_fffffffffffff568,(size_type)in_stack_fffffffffffff560);
    in_stack_fffffffffffff5b8 =
         (CCoinsViewCache *)
         std::min<PSBTRole>((PSBTRole *)in_stack_fffffffffffff560,
                            (PSBTRole *)
                            CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    *(PSBTRole *)&(psbt->witness_script).super_CScriptBase._union =
         *(PSBTRole *)
          &(in_stack_fffffffffffff5b8->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView;
    local_9cc = local_9cc + 1;
  }
  if ((int)*(PSBTRole *)&(psbt->witness_script).super_CScriptBase._union < 1) {
    __assert_fail("result.next > PSBTRole::CREATOR",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/psbt.cpp"
                  ,0x60,"PSBTAnalysis node::AnalyzePSBT(PartiallySignedTransaction)");
  }
  if (bVar1) {
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    iVar9 = std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff560);
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    iVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::end
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff560);
    out_sigdata = (SignatureData *)
                  std::
                  accumulate<__gnu_cxx::__normal_iterator<CTxOut*,std::vector<CTxOut,std::allocator<CTxOut>>>,long,node::AnalyzePSBT(PartiallySignedTransaction)::__0>
                            (iVar9._M_current,iVar10._M_current,0);
    local_970._80_8_ = out_sigdata;
    finalize = MoneyRange((CAmount *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    if (!(bool)finalize) {
      __s = local_970 + 0x4f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(finalize,in_stack_fffffffffffff5a8),__s,in_stack_fffffffffffff598);
      PSBTAnalysis::SetInvalid(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      std::allocator<char>::~allocator((allocator<char> *)(local_970 + 0x4f));
      bVar3 = true;
      goto LAB_0094f565;
    }
    local_970._64_8_ = local_9a0 - local_970._80_8_;
    std::optional<long>::optional<long_&,_true>
              ((optional<long> *)in_stack_fffffffffffff568,(long *)in_stack_fffffffffffff560);
    *(undefined8 *)((long)&(psbt->scriptSig).super_CScriptBase._union + 0x18) = local_8f8;
    (psbt->redeem_script).super_CScriptBase._union.indirect_contents.indirect = pcStack_8f0;
    std::optional<CMutableTransaction>::operator*
              ((optional<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)
               CONCAT17(in_stack_fffffffffffff58f,
                        CONCAT16(in_stack_fffffffffffff58e,in_stack_fffffffffffff588)),
               in_stack_fffffffffffff580);
    this_00 = (CTransaction *)local_970;
    CCoinsView::CCoinsView
              ((CCoinsView *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    CCoinsViewCache::CCoinsViewCache
              ((CCoinsViewCache *)CONCAT17(finalize,in_stack_fffffffffffff5a8),
               (CCoinsView *)in_stack_fffffffffffff5a0,SUB81((ulong)this_00 >> 0x38,0));
    bVar1 = true;
    local_9f0 = 0;
    while( true ) {
      pPVar8 = (PartiallySignedTransaction *)(ulong)local_9f0;
      std::optional<CMutableTransaction>::operator->
                ((optional<CMutableTransaction> *)
                 CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      pPVar11 = (PartiallySignedTransaction *)
                std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                          ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                           CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      flags = (uint32_t)((ulong)in_stack_fffffffffffff5a0 >> 0x20);
      if (pPVar11 <= pPVar8) break;
      pvVar12 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::operator[]
                          ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)
                           in_stack_fffffffffffff568,(size_type)in_stack_fffffffffffff560);
      Coin::Coin((Coin *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      in_stack_fffffffffffff558 = 1;
      bVar3 = SignPSBTInput((SigningProvider *)
                            CONCAT17(in_stack_fffffffffffff5df,
                                     CONCAT16(in_stack_fffffffffffff5de,
                                              CONCAT15(in_stack_fffffffffffff5dd,
                                                       CONCAT14(in_stack_fffffffffffff5dc,
                                                                in_stack_fffffffffffff5d8)))),
                            in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,pPVar4,
                            (int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),out_sigdata,
                            (bool)finalize);
      if ((bVar3) &&
         (in_stack_fffffffffffff58e =
               PartiallySignedTransaction::GetInputUTXO
                         (pPVar8,(CTxOut *)
                                 CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffff58e,
                                                         in_stack_fffffffffffff588)),
                          (int)((ulong)in_stack_fffffffffffff580 >> 0x20)),
         (bool)in_stack_fffffffffffff58e)) {
        in_stack_fffffffffffff580 = (CMutableTransaction *)&pvVar12->final_script_sig;
        std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                  (&in_stack_fffffffffffff568->vin,(size_type)in_stack_fffffffffffff560);
        CScript::operator=((CScript *)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
        in_stack_fffffffffffff578 = (PSBTAnalysis *)&pvVar12->final_script_witness;
        std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                  (&in_stack_fffffffffffff568->vin,(size_type)in_stack_fffffffffffff560);
        CScriptWitness::operator=
                  ((CScriptWitness *)in_stack_fffffffffffff568,
                   (CScriptWitness *)in_stack_fffffffffffff560);
        local_840 = local_840 & 1 | 2;
        std::optional<CMutableTransaction>::operator->
                  ((optional<CMutableTransaction> *)
                   CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                  (&in_stack_fffffffffffff568->vin,(size_type)in_stack_fffffffffffff560);
        CCoinsViewCache::AddCoin
                  (in_stack_fffffffffffff5b8,(COutPoint *)out_sigdata,
                   (Coin *)CONCAT17(finalize,in_stack_fffffffffffff5a8),
                   SUB81((ulong)in_stack_fffffffffffff5a0 >> 0x38,0));
        bVar3 = false;
      }
      else {
        bVar1 = false;
        bVar3 = true;
      }
      Coin::~Coin((Coin *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      flags = (uint32_t)((ulong)in_stack_fffffffffffff5a0 >> 0x20);
      if (bVar3) break;
      local_9f0 = local_9f0 + 1;
    }
    if (bVar1) {
      CTransaction::CTransaction(this_00,(CMutableTransaction *)pPVar8);
      nFeePaid = (CAmount *)
                 GetTransactionSigOpCost
                           ((CTransaction *)out_sigdata,
                            (CCoinsViewCache *)CONCAT17(finalize,in_stack_fffffffffffff5a8),flags);
      this = (optional<CFeeRate> *)
             GetVirtualTransactionSize
                       (in_stack_fffffffffffff568,(int64_t)in_stack_fffffffffffff560,
                        in_stack_fffffffffffff55c);
      std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                ((optional<unsigned_long> *)this,(unsigned_long *)in_stack_fffffffffffff560);
      psbt->complete = (bool)local_908[0];
      psbt->witness = (bool)local_908[1];
      psbt->field_0x2 = local_908[2];
      psbt->field_0x3 = local_908[3];
      psbt->field_0x4 = local_908[4];
      psbt->field_0x5 = local_908[5];
      psbt->field_0x6 = local_908[6];
      psbt->field_0x7 = local_908[7];
      (psbt->scriptSig).super_CScriptBase._union.indirect_contents.indirect = pcStack_900;
      CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffff578,nFeePaid,
                         (uint32_t)((ulong)this >> 0x20));
      std::optional<CFeeRate>::operator=(this,(CFeeRate *)in_stack_fffffffffffff560);
      CTransaction::~CTransaction
                ((CTransaction *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    }
    CCoinsViewCache::~CCoinsViewCache
              ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    CMutableTransaction::~CMutableTransaction
              ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558))
    ;
  }
  bVar3 = true;
LAB_0094f565:
  PrecomputedTransactionData::~PrecomputedTransactionData
            ((PrecomputedTransactionData *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  if (!bVar3) {
    PSBTAnalysis::~PSBTAnalysis
              ((PSBTAnalysis *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (PSBTAnalysis *)in_RDI;
}

Assistant:

PSBTAnalysis AnalyzePSBT(PartiallySignedTransaction psbtx)
{
    // Go through each input and build status
    PSBTAnalysis result;

    bool calc_fee = true;

    CAmount in_amt = 0;

    result.inputs.resize(psbtx.tx->vin.size());

    const PrecomputedTransactionData txdata = PrecomputePSBTData(psbtx);

    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        PSBTInput& input = psbtx.inputs[i];
        PSBTInputAnalysis& input_analysis = result.inputs[i];

        // We set next role here and ratchet backwards as required
        input_analysis.next = PSBTRole::EXTRACTOR;

        // Check for a UTXO
        CTxOut utxo;
        if (psbtx.GetInputUTXO(utxo, i)) {
            if (!MoneyRange(utxo.nValue) || !MoneyRange(in_amt + utxo.nValue)) {
                result.SetInvalid(strprintf("PSBT is not valid. Input %u has invalid value", i));
                return result;
            }
            in_amt += utxo.nValue;
            input_analysis.has_utxo = true;
        } else {
            if (input.non_witness_utxo && psbtx.tx->vin[i].prevout.n >= input.non_witness_utxo->vout.size()) {
                result.SetInvalid(strprintf("PSBT is not valid. Input %u specifies invalid prevout", i));
                return result;
            }
            input_analysis.has_utxo = false;
            input_analysis.is_final = false;
            input_analysis.next = PSBTRole::UPDATER;
            calc_fee = false;
        }

        if (!utxo.IsNull() && utxo.scriptPubKey.IsUnspendable()) {
            result.SetInvalid(strprintf("PSBT is not valid. Input %u spends unspendable output", i));
            return result;
        }

        // Check if it is final
        if (!PSBTInputSignedAndVerified(psbtx, i, &txdata)) {
            input_analysis.is_final = false;

            // Figure out what is missing
            SignatureData outdata;
            bool complete = SignPSBTInput(DUMMY_SIGNING_PROVIDER, psbtx, i, &txdata, 1, &outdata);

            // Things are missing
            if (!complete) {
                input_analysis.missing_pubkeys = outdata.missing_pubkeys;
                input_analysis.missing_redeem_script = outdata.missing_redeem_script;
                input_analysis.missing_witness_script = outdata.missing_witness_script;
                input_analysis.missing_sigs = outdata.missing_sigs;

                // If we are only missing signatures and nothing else, then next is signer
                if (outdata.missing_pubkeys.empty() && outdata.missing_redeem_script.IsNull() && outdata.missing_witness_script.IsNull() && !outdata.missing_sigs.empty()) {
                    input_analysis.next = PSBTRole::SIGNER;
                } else {
                    input_analysis.next = PSBTRole::UPDATER;
                }
            } else {
                input_analysis.next = PSBTRole::FINALIZER;
            }
        } else if (!utxo.IsNull()){
            input_analysis.is_final = true;
        }
    }

    // Calculate next role for PSBT by grabbing "minimum" PSBTInput next role
    result.next = PSBTRole::EXTRACTOR;
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        PSBTInputAnalysis& input_analysis = result.inputs[i];
        result.next = std::min(result.next, input_analysis.next);
    }
    assert(result.next > PSBTRole::CREATOR);

    if (calc_fee) {
        // Get the output amount
        CAmount out_amt = std::accumulate(psbtx.tx->vout.begin(), psbtx.tx->vout.end(), CAmount(0),
            [](CAmount a, const CTxOut& b) {
                if (!MoneyRange(a) || !MoneyRange(b.nValue) || !MoneyRange(a + b.nValue)) {
                    return CAmount(-1);
                }
                return a += b.nValue;
            }
        );
        if (!MoneyRange(out_amt)) {
            result.SetInvalid("PSBT is not valid. Output amount invalid");
            return result;
        }

        // Get the fee
        CAmount fee = in_amt - out_amt;
        result.fee = fee;

        // Estimate the size
        CMutableTransaction mtx(*psbtx.tx);
        CCoinsView view_dummy;
        CCoinsViewCache view(&view_dummy);
        bool success = true;

        for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
            PSBTInput& input = psbtx.inputs[i];
            Coin newcoin;

            if (!SignPSBTInput(DUMMY_SIGNING_PROVIDER, psbtx, i, nullptr, 1) || !psbtx.GetInputUTXO(newcoin.out, i)) {
                success = false;
                break;
            } else {
                mtx.vin[i].scriptSig = input.final_script_sig;
                mtx.vin[i].scriptWitness = input.final_script_witness;
                newcoin.nHeight = 1;
                view.AddCoin(psbtx.tx->vin[i].prevout, std::move(newcoin), true);
            }
        }

        if (success) {
            CTransaction ctx = CTransaction(mtx);
            size_t size(GetVirtualTransactionSize(ctx, GetTransactionSigOpCost(ctx, view, STANDARD_SCRIPT_VERIFY_FLAGS), ::nBytesPerSigOp));
            result.estimated_vsize = size;
            // Estimate fee rate
            CFeeRate feerate(fee, size);
            result.estimated_feerate = feerate;
        }

    }

    return result;
}